

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFboUtil.cpp
# Opt level: O0

void __thiscall
deqp::gls::FboUtil::FboBuilder::glAttach(FboBuilder *this,GLenum attPoint,Attachment *att)

{
  Attachment *att_local;
  GLenum attPoint_local;
  FboBuilder *this_local;
  
  if (att == (Attachment *)0x0) {
    (*this->m_gl->framebufferRenderbuffer)(this->m_target,attPoint,0x8d41,0);
  }
  else {
    FboUtil::config::attachAttachment(att,attPoint,this->m_gl);
  }
  checkError(this);
  FboUtil::config::Framebuffer::attach(&this->super_Framebuffer,attPoint,att);
  return;
}

Assistant:

void FboBuilder::glAttach (GLenum attPoint, const Attachment* att)
{
	if (att == NULL)
		m_gl.framebufferRenderbuffer(m_target, attPoint, GL_RENDERBUFFER, 0);
	else
		attachAttachment(*att, attPoint, m_gl);
	checkError();
	attach(attPoint, att);
}